

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * kj::str<float>(String *__return_storage_ptr__,float *params)

{
  String *result;
  char *__dest;
  CappedArray<char,_24UL> local_30;
  
  _::Stringifier::operator*(&local_30,(Stringifier *)&_::STR,*params);
  heapString(__return_storage_ptr__,local_30.currentSize);
  if (local_30.currentSize != 0) {
    __dest = (char *)(__return_storage_ptr__->content).size_;
    if (__dest != (char *)0x0) {
      __dest = (__return_storage_ptr__->content).ptr;
    }
    memcpy(__dest,local_30.content,local_30.currentSize);
  }
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}